

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall xray_re::cse_abstract::cse_abstract(cse_abstract *this)

{
  cse_abstract *this_local;
  
  this->_vptr_cse_abstract = (_func_int **)&PTR__cse_abstract_003898a0;
  std::__cxx11::string::string((string *)&this->m_s_name_replace);
  this->m_version = 0;
  this->m_script_version = 0;
  this->m_respawn_time = 0;
  this->m_id = 0xffff;
  this->m_id_parent = 0xffff;
  this->m_id_phantom = 0xffff;
  std::__cxx11::string::string((string *)&this->m_s_name);
  this->m_s_game_id = '\0';
  this->m_s_rp = 0xfe;
  this->m_s_flags = 0;
  this->m_cs_unk1_u16 = 0xffff;
  std::__cxx11::string::string((string *)&this->m_ini_string);
  this->m_spawn_id = 0xffff;
  xr_clsid::xr_clsid(&this->m_clsid);
  std::
  stack<xray_re::cse_abstract::sm_record,std::deque<xray_re::cse_abstract::sm_record,std::allocator<xray_re::cse_abstract::sm_record>>>
  ::
  stack<std::deque<xray_re::cse_abstract::sm_record,std::allocator<xray_re::cse_abstract::sm_record>>,void>
            ((stack<xray_re::cse_abstract::sm_record,std::deque<xray_re::cse_abstract::sm_record,std::allocator<xray_re::cse_abstract::sm_record>>>
              *)&this->m_markers);
  _vector3<float>::set(&this->m_o_position,0.0,0.0,0.0);
  _vector3<float>::set(&this->m_o_angle,0.0,0.0,0.0);
  return;
}

Assistant:

cse_abstract::cse_abstract():
	m_version(0), m_script_version(0), m_respawn_time(0),
	m_id(UNDEF16), m_id_parent(UNDEF16), m_id_phantom(UNDEF16),
	m_s_game_id(GAME_ANY), m_s_rp(0xfe), m_s_flags(0),
	m_cs_unk1_u16(UNDEF16),
	m_spawn_id(UNDEF16)
{
	m_o_position.set();
	m_o_angle.set();
}